

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPseudocost.h
# Opt level: O2

void __thiscall HighsPseudocost::increaseConflictWeight(HighsPseudocost *this)

{
  pointer pdVar1;
  pointer pdVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  
  dVar6 = this->conflict_weight * 1.02;
  this->conflict_weight = dVar6;
  if (1000.0 < dVar6) {
    dVar6 = 1.0 / dVar6;
    this->conflict_weight = 1.0;
    this->conflict_avg_score = this->conflict_avg_score * dVar6;
    pdVar1 = (this->conflictscoreup).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = (ulong)((long)(this->conflictscoreup).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pdVar1) >> 3;
    pdVar2 = (this->conflictscoredown).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = 0;
    uVar4 = uVar3 & 0xffffffff;
    if ((int)uVar3 < 1) {
      uVar4 = uVar5;
    }
    for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      pdVar1[uVar5] = pdVar1[uVar5] * dVar6;
      pdVar2[uVar5] = pdVar2[uVar5] * dVar6;
    }
  }
  return;
}

Assistant:

void increaseConflictWeight() {
    conflict_weight *= 1.02;

    if (conflict_weight > 1000.0) {
      double scale = 1.0 / conflict_weight;
      conflict_weight = 1.0;
      conflict_avg_score *= scale;

      HighsInt numCol = conflictscoreup.size();
      for (HighsInt i = 0; i < numCol; ++i) {
        conflictscoreup[i] *= scale;
        conflictscoredown[i] *= scale;
      }
    }
  }